

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O3

Mat * __thiscall
ncnn::ModelBin::load(Mat *__return_storage_ptr__,ModelBin *this,int w,int h,int type)

{
  Mat local_68;
  
  (*this->_vptr_ModelBin[2])(&local_68,this,(ulong)(uint)(h * w),type);
  if ((local_68.data == (void *)0x0) || (local_68.cstep * (long)local_68.c == 0)) {
    __return_storage_ptr__->data = local_68.data;
    __return_storage_ptr__->refcount = local_68.refcount;
    __return_storage_ptr__->elemsize = local_68.elemsize;
    __return_storage_ptr__->elempack = local_68.elempack;
    __return_storage_ptr__->allocator = local_68.allocator;
    __return_storage_ptr__->dims = local_68.dims;
    __return_storage_ptr__->w = local_68.w;
    __return_storage_ptr__->h = local_68.h;
    __return_storage_ptr__->d = local_68.d;
    __return_storage_ptr__->c = local_68.c;
    __return_storage_ptr__->cstep = local_68.cstep;
    if (local_68.refcount != (int *)0x0) {
      LOCK();
      *local_68.refcount = *local_68.refcount + 1;
      UNLOCK();
    }
  }
  else {
    Mat::reshape(__return_storage_ptr__,&local_68,w,h,(Allocator *)0x0);
  }
  if (local_68.refcount != (int *)0x0) {
    LOCK();
    *local_68.refcount = *local_68.refcount + -1;
    UNLOCK();
    if (*local_68.refcount == 0) {
      if (local_68.allocator == (Allocator *)0x0) {
        if (local_68.data != (void *)0x0) {
          free(local_68.data);
        }
      }
      else {
        (*(local_68.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBin::load(int w, int h, int type) const
{
    Mat m = load(w * h, type);
    if (m.empty())
        return m;

    return m.reshape(w, h);
}